

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fast-dtoa.cc
# Opt level: O0

void TestFastDtoaShortestVariousFloats(void)

{
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  Vector<char> buffer_08;
  Vector<char> buffer_09;
  bool bVar1;
  float fVar2;
  uint32_t largest_denormal32;
  float v;
  uint32_t smallest_normal32;
  float max_float;
  float min_float;
  bool status;
  int point;
  int length;
  Vector<char> buffer;
  char buffer_container [100];
  char *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  Single in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  int line;
  char *in_stack_fffffffffffffed0;
  int *expected_source;
  undefined8 in_stack_fffffffffffffed8;
  int iVar4;
  char *pcVar3;
  char *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar5;
  int *in_stack_fffffffffffffef0;
  int *length_00;
  undefined8 in_stack_fffffffffffffef8;
  char *pcVar6;
  double in_stack_ffffffffffffff00;
  int *v_00;
  char *in_stack_ffffffffffffff08;
  char *pcVar7;
  undefined8 in_stack_ffffffffffffff10;
  int *piVar8;
  undefined1 local_78 [16];
  char local_68 [104];
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  double_conversion::Vector<char>::Vector((Vector<char> *)local_78,local_68,100);
  buffer_00._8_8_ = in_stack_ffffffffffffff10;
  buffer_00.start_ = in_stack_ffffffffffffff08;
  double_conversion::FastDtoa
            (in_stack_ffffffffffffff00,(FastDtoaMode)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (int)in_stack_fffffffffffffef8,buffer_00,in_stack_fffffffffffffef0,
             (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  CheckHelper(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
              SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                    (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8.d32_),
                    in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                    in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  buffer_01._8_8_ = in_stack_ffffffffffffff10;
  buffer_01.start_ = in_stack_ffffffffffffff08;
  double_conversion::FastDtoa
            (in_stack_ffffffffffffff00,(FastDtoaMode)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (int)in_stack_fffffffffffffef8,buffer_01,in_stack_fffffffffffffef0,
             (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  CheckHelper(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
              SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                    (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8.d32_),
                    in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                    in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  buffer_02._8_8_ = in_stack_ffffffffffffff10;
  buffer_02.start_ = in_stack_ffffffffffffff08;
  double_conversion::FastDtoa
            (in_stack_ffffffffffffff00,(FastDtoaMode)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (int)in_stack_fffffffffffffef8,buffer_02,in_stack_fffffffffffffef0,
             (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  CheckHelper(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
              SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                    (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8.d32_),
                    in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                    in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  buffer_03._8_8_ = in_stack_ffffffffffffff10;
  buffer_03.start_ = in_stack_ffffffffffffff08;
  double_conversion::FastDtoa
            (in_stack_ffffffffffffff00,(FastDtoaMode)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (int)in_stack_fffffffffffffef8,buffer_03,in_stack_fffffffffffffef0,
             (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  CheckHelper(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
              SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                    (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8.d32_),
                    in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                    in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  buffer_04._8_8_ = in_stack_ffffffffffffff10;
  buffer_04.start_ = in_stack_ffffffffffffff08;
  double_conversion::FastDtoa
            (in_stack_ffffffffffffff00,(FastDtoaMode)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (int)in_stack_fffffffffffffef8,buffer_04,in_stack_fffffffffffffef0,
             (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  CheckHelper(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
              SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                    (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8.d32_),
                    in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                    in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  buffer_05._8_8_ = local_78._0_8_;
  buffer_05.start_ = in_stack_ffffffffffffff08;
  piVar8 = (int *)local_78._0_8_;
  double_conversion::FastDtoa
            (in_stack_ffffffffffffff00,(FastDtoaMode)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (int)in_stack_fffffffffffffef8,buffer_05,in_stack_fffffffffffffef0,
             (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  CheckHelper(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
              SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                    (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8.d32_),
                    in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                    in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  buffer_06._8_8_ = piVar8;
  buffer_06.start_ = (char *)local_78._8_8_;
  v_00 = (int *)local_78._0_8_;
  pcVar7 = (char *)local_78._8_8_;
  double_conversion::FastDtoa
            ((double)local_78._0_8_,(FastDtoaMode)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (int)in_stack_fffffffffffffef8,buffer_06,in_stack_fffffffffffffef0,
             (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  CheckHelper(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
              SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                    (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8.d32_),
                    in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                    in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                    (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  buffer_07._8_8_ = piVar8;
  buffer_07.start_ = pcVar7;
  length_00 = (int *)local_78._0_8_;
  pcVar6 = (char *)local_78._8_8_;
  bVar1 = double_conversion::FastDtoa
                    ((double)v_00,SUB84(local_78._8_8_,4),(int)local_78._8_8_,buffer_07,
                     (int *)local_78._0_8_,
                     (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (bVar1) {
    double_conversion::Vector<char>::start((Vector<char> *)local_78);
    CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                      (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8.d32_),
                      in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,in_stack_fffffffffffffed0,
                      in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                      (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  }
  uVar5 = 0x800000;
  double_conversion::Single::Single((Single *)&stack0xfffffffffffffee4,0x800000);
  fVar2 = double_conversion::Single::value((Single *)0x86372d);
  buffer_08._8_8_ = piVar8;
  buffer_08.start_ = pcVar7;
  expected_source = (int *)local_78._0_8_;
  pcVar3 = (char *)local_78._8_8_;
  bVar1 = double_conversion::FastDtoa
                    ((double)v_00,(FastDtoaMode)((ulong)pcVar6 >> 0x20),(int)pcVar6,buffer_08,
                     length_00,(int *)CONCAT44(uVar5,fVar2));
  iVar4 = (int)((ulong)pcVar3 >> 0x20);
  if (bVar1) {
    double_conversion::Vector<char>::start((Vector<char> *)local_78);
    CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,(char *)expected_source,
                      (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8.d32_),
                      in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,(char *)expected_source,
                      in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                      (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  }
  line = 0x7fffff;
  double_conversion::Single::Single((Single *)&stack0xfffffffffffffec8,0x7fffff);
  fVar2 = double_conversion::Single::value((Single *)0x863811);
  buffer_09._8_8_ = piVar8;
  buffer_09.start_ = pcVar7;
  double_conversion::FastDtoa
            ((double)v_00,(FastDtoaMode)((ulong)pcVar6 >> 0x20),(int)pcVar6,buffer_09,length_00,
             (int *)CONCAT44(uVar5,fVar2));
  CheckHelper((char *)expected_source,line,(char *)local_78._8_8_,
              SUB81((ulong)local_78._0_8_ >> 0x38,0));
  double_conversion::Vector<char>::start((Vector<char> *)local_78);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,(char *)expected_source,
                    (char *)CONCAT44(line,in_stack_fffffffffffffec8.d32_),(char *)local_78._8_8_,
                    (char *)local_78._0_8_);
  CheckEqualsHelper(in_stack_fffffffffffffee0,iVar4,(char *)expected_source,line,
                    (char *)local_78._8_8_,(int)((ulong)local_78._0_8_ >> 0x20));
  return;
}

Assistant:

TEST(FastDtoaShortestVariousFloats) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;
  bool status;

  float min_float = 1e-45f;
  status = FastDtoa(min_float, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(-44, point);


  float max_float = 3.4028234e38f;
  status = FastDtoa(max_float, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("34028235", buffer.start());
  CHECK_EQ(39, point);

  status = FastDtoa(4294967272.0f, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("42949673", buffer.start());
  CHECK_EQ(10, point);

  status = FastDtoa(3.32306998946228968226e+35f, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("332307", buffer.start());
  CHECK_EQ(36, point);

  status = FastDtoa(1.2341e-41f, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("12341", buffer.start());
  CHECK_EQ(-40, point);

  status = FastDtoa(3.3554432e7, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("33554432", buffer.start());
  CHECK_EQ(8, point);

  status = FastDtoa(3.26494756798464e14f, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("32649476", buffer.start());
  CHECK_EQ(15, point);

  status = FastDtoa(3.91132223637771935344e37f, FAST_DTOA_SHORTEST_SINGLE, 0,
                    buffer, &length, &point);
  if (status) {  // Not all FastDtoa variants manage to compute this number.
    CHECK_EQ("39113222", buffer.start());
    CHECK_EQ(38, point);
  }

  uint32_t smallest_normal32 = 0x00800000;
  float v = Single(smallest_normal32).value();
  status = FastDtoa(v, FAST_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
  if (status) {
    CHECK_EQ("11754944", buffer.start());
    CHECK_EQ(-37, point);
  }

  uint32_t largest_denormal32 = 0x007FFFFF;
  v = Single(largest_denormal32).value();
  status = FastDtoa(v, FAST_DTOA_SHORTEST_SINGLE, 0, buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("11754942", buffer.start());
  CHECK_EQ(-37, point);
}